

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall XmlModelSerialiser::saveModel(XmlModelSerialiser *this,QByteArray *destination)

{
  QXmlStreamWriter local_30 [8];
  QXmlStreamWriter writer;
  XmlModelSerialiserPrivate *d;
  QByteArray *destination_local;
  XmlModelSerialiser *this_local;
  
  if (destination == (QByteArray *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    _writer = d_func(this);
    if ((_writer->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
        m_constModel == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      QXmlStreamWriter::QXmlStreamWriter(local_30,(QByteArray *)destination);
      this_local._7_1_ = XmlModelSerialiserPrivate::writeXml(_writer,local_30);
      QXmlStreamWriter::~QXmlStreamWriter(local_30);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool XmlModelSerialiser::saveModel(QByteArray *destination) const
{
    if (!destination)
        return false;
    Q_D(const XmlModelSerialiser);

    if (!d->m_constModel)
        return false;
    QXmlStreamWriter writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeXml(writer);
}